

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O1

Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> * __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *__return_storage_ptr__,
          Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,PolyNf *simplifiedTerms)

{
  InnerType *r;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar2;
  ulong uVar3;
  int iVar4;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *o;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_e8;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_c0;
  PolyNf *local_b8;
  Numeral local_b0;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_90;
  MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> local_60;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_40;
  
  local_e8._cursor = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_e8._end = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_e8._capacity = 0;
  local_e8._stack = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_b8 = simplifiedTerms;
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::reserve
            (&local_e8,
             (ulong)(uint)((int)((ulong)((long)(this->_summands)._cursor -
                                        (long)(this->_summands)._stack) >> 4) * -0x55555555));
  o = (this->_summands)._stack;
  local_c0 = (this->_summands)._cursor;
  if (o != local_c0) {
    iVar4 = 0;
    do {
      IntegerConstantType::IntegerConstantType(&local_b0._num,(IntegerConstantType *)o);
      IntegerConstantType::IntegerConstantType(&local_b0._den,&(o->numeral)._den);
      MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::replaceTerms
                (&local_60,(o->factors)._ptr,local_b8 + iVar4);
      ::Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)&local_40,&local_60);
      Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_90,&local_b0,&local_40);
      if (local_e8._cursor == local_e8._end) {
        ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::expand
                  (&local_e8);
      }
      pMVar2 = local_e8._cursor;
      IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)local_e8._cursor,(IntegerConstantType *)&local_90);
      r = &local_90.numeral._den;
      IntegerConstantType::IntegerConstantType(&(pMVar2->numeral)._den,r);
      (pMVar2->factors)._id = local_90.factors._id;
      (pMVar2->factors)._ptr = local_90.factors._ptr;
      local_e8._cursor = local_e8._cursor + 1;
      mpz_clear(r->_val);
      mpz_clear((__mpz_struct *)&local_90);
      if (local_60._factors._stack !=
          (MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
        uVar3 = local_60._factors._capacity * 0x1c + 0xf & 0xfffffffffffffff0;
        if (uVar3 == 0) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_60._factors._stack;
        }
        else if (uVar3 < 0x11) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_60._factors._stack;
        }
        else if (uVar3 < 0x19) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_60._factors._stack;
        }
        else if (uVar3 < 0x21) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_60._factors._stack;
        }
        else if (uVar3 < 0x31) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_60._factors._stack;
        }
        else if (uVar3 < 0x41) {
          *(undefined8 *)
           &((local_60._factors._stack)->term).super_PolyNfSuper._inner.
            super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
            .
            super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
               = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_60._factors._stack;
        }
        else {
          operator_delete(local_60._factors._stack,0x10);
        }
      }
      mpz_clear(local_b0._den._val);
      mpz_clear((__mpz_struct *)&local_b0);
      pMVar1 = (o->factors)._ptr;
      iVar4 = iVar4 + (int)((ulong)((long)(pMVar1->_factors)._cursor -
                                   (long)(pMVar1->_factors)._stack) >> 2) * -0x49249249;
      o = o + 1;
    } while (o != local_c0);
  }
  Polynom(__return_storage_ptr__,&local_e8);
  ::Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

Polynom<Number> Polynom<Number>::replaceTerms(PolyNf* simplifiedTerms) const 
{
  int offs = 0;
  Stack<Monom> out;
  out.reserve(nSummands());

  for (auto& monom : _summands) {
    out.push(Monom(
          monom.numeral, 
          perfect(monom.factors->replaceTerms(&simplifiedTerms[offs]))));
    offs += monom.factors->nFactors();
  }
  return Polynom(std::move(out));
}